

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::clear(PixelBufferAccess *access,Vec4 *color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TextureFormat *pTVar4;
  int local_6c;
  int local_68;
  int x;
  int y_1;
  int z_1;
  int y;
  int z;
  deUint8 local_30 [8];
  anon_union_8_2_c961180f pixel;
  int local_20;
  int iStack_1c;
  bool rowPixelsTightlyPacked;
  int pixelPitch;
  int pixelSize;
  Vec4 *color_local;
  PixelBufferAccess *access_local;
  
  _pixelPitch = color;
  color_local = (Vec4 *)access;
  pTVar4 = ConstPixelBufferAccess::getFormat(&access->super_ConstPixelBufferAccess);
  iStack_1c = TextureFormat::getPixelSize(pTVar4);
  local_20 = ConstPixelBufferAccess::getPixelPitch((ConstPixelBufferAccess *)color_local);
  pixel.u8[7] = iStack_1c == local_20;
  iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)color_local);
  iVar2 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)color_local);
  iVar3 = ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)color_local);
  if (((iVar1 * iVar2 * iVar3 < 0x80) || (7 < iStack_1c)) || ((pixel.u8[7] & 1) == 0)) {
    for (x = 0; iVar1 = ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)color_local),
        x < iVar1; x = x + 1) {
      for (local_68 = 0;
          iVar1 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)color_local),
          local_68 < iVar1; local_68 = local_68 + 1) {
        for (local_6c = 0;
            iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)color_local),
            local_6c < iVar1; local_6c = local_6c + 1) {
          PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)color_local,_pixelPitch,local_6c,local_68,x);
        }
      }
    }
  }
  else {
    pTVar4 = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)color_local);
    PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&y,pTVar4,1,1,1,0,0,local_30);
    PixelBufferAccess::setPixel((PixelBufferAccess *)&y,_pixelPitch,0,0,0);
    for (z_1 = 0; iVar1 = ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)color_local),
        z_1 < iVar1; z_1 = z_1 + 1) {
      for (y_1 = 0; iVar1 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)color_local)
          , y_1 < iVar1; y_1 = y_1 + 1) {
        fillRow((PixelBufferAccess *)color_local,y_1,z_1,iStack_1c,local_30);
      }
    }
  }
  return;
}

Assistant:

void clear (const PixelBufferAccess& access, const Vec4& color)
{
	const int	pixelSize				= access.getFormat().getPixelSize();
	const int	pixelPitch				= access.getPixelPitch();
	const bool	rowPixelsTightlyPacked	= (pixelSize == pixelPitch);

	if (access.getWidth()*access.getHeight()*access.getDepth() >= CLEAR_OPTIMIZE_THRESHOLD &&
		pixelSize < CLEAR_OPTIMIZE_MAX_PIXEL_SIZE && rowPixelsTightlyPacked)
	{
		// Convert to destination format.
		union
		{
			deUint8		u8[CLEAR_OPTIMIZE_MAX_PIXEL_SIZE];
			deUint64	u64; // Forces 64-bit alignment.
		} pixel;
		DE_STATIC_ASSERT(sizeof(pixel) == CLEAR_OPTIMIZE_MAX_PIXEL_SIZE);
		PixelBufferAccess(access.getFormat(), 1, 1, 1, 0, 0, &pixel.u8[0]).setPixel(color, 0, 0);

		for (int z = 0; z < access.getDepth(); z++)
			for (int y = 0; y < access.getHeight(); y++)
				fillRow(access, y, z, pixelSize, &pixel.u8[0]);
	}
	else
	{
		for (int z = 0; z < access.getDepth(); z++)
			for (int y = 0; y < access.getHeight(); y++)
				for (int x = 0; x < access.getWidth(); x++)
					access.setPixel(color, x, y, z);
	}
}